

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TType::TType(TType *this,TPublicType *p)

{
  undefined1 *puVar1;
  TBasicType TVar2;
  TType *this_00;
  TArraySizes *pTVar3;
  TVector<glslang::TArraySize> *pTVar4;
  TTypeParameters *pTVar5;
  TSpirvType *pTVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  TSampler TVar11;
  int iVar12;
  uint uVar13;
  anon_union_8_2_8ac53c11_for_TType_13 aVar14;
  undefined4 extraout_var;
  TString *pTVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  TQualifier *pTVar24;
  TQualifier *pTVar25;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_00a5b280;
  uVar13 = *(uint *)&this->field_0x8;
  uVar23 = (uint)(byte)(char)p->basicType;
  *(uint *)&this->field_0x8 = uVar13 & 0xffffff00 | uVar23;
  uVar18 = (*(uint *)&p->field_0xb8 & 0xf) << 8;
  *(uint *)&this->field_0x8 = uVar13 & 0xfffff000 | uVar23 | uVar18;
  uVar19 = (*(uint *)&p->field_0xb8 & 0xf0) << 8;
  *(uint *)&this->field_0x8 = uVar13 & 0xffff0000 | uVar23 | uVar18 | uVar19;
  uVar20 = (*(uint *)&p->field_0xb8 & 0xf00) << 8;
  *(uint *)&this->field_0x8 = uVar13 & 0xffe00000 | uVar23 | uVar18 | uVar19 | uVar20;
  uVar21 = (*(uint *)&p->field_0xb8 & 0x1000) << 9;
  *(uint *)&this->field_0x8 = uVar13 & 0xffc00000 | uVar23 | uVar18 | uVar19 | uVar20 | uVar21;
  uVar22 = (*(uint *)&p->field_0xb8 & 0x2000) << 9;
  *(uint *)&this->field_0x8 =
       uVar22 | uVar13 & 0xf8000000 | uVar23 | uVar18 | uVar19 | uVar20 | uVar21;
  uVar16 = (*(uint *)&p->field_0xb8 & 0x4000) << 0xd;
  *(uint *)&this->field_0x8 =
       uVar22 | uVar13 & 0xf0000000 | uVar23 | uVar18 | uVar19 | uVar20 | uVar21 | uVar16;
  this->arraySizes = p->arraySizes;
  this->typeName = (TString *)0x0;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  uVar7 = *(undefined4 *)((long)&p->typeParameters + 4);
  uVar8 = *(undefined4 *)&p->spirvType;
  uVar9 = *(undefined4 *)((long)&p->spirvType + 4);
  *(undefined4 *)&this->typeParameters = *(undefined4 *)&p->typeParameters;
  *(undefined4 *)((long)&this->typeParameters + 4) = uVar7;
  *(undefined4 *)&this->spirvType = uVar8;
  *(undefined4 *)((long)&this->spirvType + 4) = uVar9;
  if (uVar23 == 0xe) {
    TVar11 = p->sampler;
  }
  else {
    TVar11 = (TSampler)((uint)this->sampler & 0x80000000 | 0x1f000000);
  }
  this->sampler = TVar11;
  pTVar24 = &p->qualifier;
  pTVar25 = &this->qualifier;
  for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
    pTVar25->semanticName = pTVar24->semanticName;
    pTVar24 = (TQualifier *)&pTVar24->field_0x8;
    pTVar25 = (TQualifier *)&pTVar25->field_0x8;
  }
  this_00 = p->userDef;
  if (this_00 != (TType *)0x0) {
    if (this_00->field_0x8 == '\x12') {
      *(uint *)&this->field_0x8 =
           uVar22 | uVar13 & 0xf0000000 | uVar18 | uVar19 | uVar20 | uVar21 | uVar16 | 0x12;
      aVar14 = p->userDef->field_13;
    }
    else {
      aVar14.structure = getWritableStruct(this_00);
    }
    this->field_13 = aVar14;
    iVar12 = (*p->userDef->_vptr_TType[5])();
    pTVar15 = NewPoolTString_abi_cxx11_(*(char **)(CONCAT44(extraout_var,iVar12) + 8));
    this->typeName = pTVar15;
  }
  if (((p->field_0xb9 & 0x10) != 0) && (p->typeParameters != (TTypeParameters *)0x0)) {
    pTVar3 = p->typeParameters->arraySizes;
    pTVar4 = (pTVar3->sizes).sizes;
    if ((pTVar4 != (TVector<glslang::TArraySize> *)0x0) &&
       (0 < (int)((ulong)((long)(pTVar4->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar4->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      uVar13 = TSmallArrayVector::getDimSize(&pTVar3->sizes,0);
      TVar2 = p->basicType;
      uVar23 = uVar13 ^ 0x10;
      if (TVar2 == EbtFloat && uVar23 == 0) {
        uVar10 = 3;
      }
      else if ((uVar13 ^ 8) == 0 && (TVar2 ^ EbtUint) == EbtVoid) {
        uVar10 = 5;
      }
      else if ((TVar2 ^ EbtUint) == EbtVoid && uVar23 == 0) {
        uVar10 = 7;
      }
      else if ((uVar13 ^ 8) == 0 && (TVar2 ^ EbtInt) == EbtVoid) {
        uVar10 = 4;
      }
      else {
        if (uVar23 != 0 || (TVar2 ^ EbtInt) != EbtVoid) goto LAB_0042a3b5;
        uVar10 = 6;
      }
      this->field_0x8 = uVar10;
      puVar1 = &(this->qualifier).field_0xb;
      *puVar1 = *puVar1 & 0xf1;
    }
  }
LAB_0042a3b5:
  if (((((p->field_0xb9 & 0x20) != 0) &&
       (pTVar5 = p->typeParameters, pTVar5 != (TTypeParameters *)0x0)) &&
      (pTVar4 = (pTVar5->arraySizes->sizes).sizes, pTVar4 != (TVector<glslang::TArraySize> *)0x0))
     && (0 < (int)((ulong)((long)(pTVar4->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar4->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    this->field_0x8 = (char)pTVar5->basicType;
    iVar12 = (*this->_vptr_TType[7])(this);
    pTVar5 = p->typeParameters;
    if (iVar12 == 0x1a) {
      pTVar6 = pTVar5->spirvType;
      if (pTVar6 == (TSpirvType *)0x0) {
        __assert_fail("p.typeParameters->spirvType",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x65d,"glslang::TType::TType(const TPublicType &)");
      }
      this->spirvType = pTVar6;
    }
    pTVar3 = pTVar5->arraySizes;
    pTVar4 = (pTVar3->sizes).sizes;
    if ((pTVar4 != (TVector<glslang::TArraySize> *)0x0) &&
       (((long)(pTVar4->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pTVar4->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) == 0x40)) {
      uVar13 = TSmallArrayVector::getDimSize(&pTVar3->sizes,3);
      if ((int)uVar13 < 0) {
        __assert_fail("dimSize >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x663,"glslang::TType::TType(const TPublicType &)");
      }
      *(uint *)&this->field_0x8 =
           (uVar13 & 7) * 0x800000 + (*(uint *)&this->field_0x8 & 0xf87fffff) + 0x4000000;
    }
  }
  if (((p->field_0xb9 & 0x40) != 0) && (p->typeParameters != (TTypeParameters *)0x0)) {
    this->field_0x8 = (char)p->typeParameters->basicType;
  }
  return;
}

Assistant:

explicit TType(const TPublicType& p) :
                            basicType(p.basicType),
                            vectorSize(p.vectorSize), matrixCols(p.matrixCols), matrixRows(p.matrixRows), vector1(false), coopmatNV(p.coopmatNV), coopmatKHR(p.coopmatKHR), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(p.coopvecNV),
                            arraySizes(p.arraySizes), structure(nullptr), fieldName(nullptr), typeName(nullptr), typeParameters(p.typeParameters),
                            spirvType(p.spirvType)
                            {
                                if (basicType == EbtSampler)
                                    sampler = p.sampler;
                                else
                                    sampler.clear();
                                qualifier = p.qualifier;
                                if (p.userDef) {
                                    if (p.userDef->basicType == EbtReference) {
                                        basicType = EbtReference;
                                        referentType = p.userDef->referentType;
                                    } else {
                                        structure = p.userDef->getWritableStruct();  // public type is short-lived; there are no sharing issues
                                    }
                                    typeName = NewPoolTString(p.userDef->getTypeName().c_str());
                                }
                                if (p.isCoopmatNV() && p.typeParameters && p.typeParameters->arraySizes->getNumDims() > 0) {
                                    int numBits = p.typeParameters->arraySizes->getDimSize(0);
                                    if (p.basicType == EbtFloat && numBits == 16) {
                                        basicType = EbtFloat16;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtUint && numBits == 8) {
                                        basicType = EbtUint8;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtUint && numBits == 16) {
                                        basicType = EbtUint16;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtInt && numBits == 8) {
                                        basicType = EbtInt8;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtInt && numBits == 16) {
                                        basicType = EbtInt16;
                                        qualifier.precision = EpqNone;
                                    }
                                }
                                if (p.isCoopmatKHR() && p.typeParameters && p.typeParameters->arraySizes->getNumDims() > 0) {
                                    basicType = p.typeParameters->basicType;
                                    if (isSpirvType()) {
                                        assert(p.typeParameters->spirvType);
                                        spirvType = p.typeParameters->spirvType;
                                    }

                                    if (p.typeParameters->arraySizes->getNumDims() == 4) {
                                        const int dimSize = p.typeParameters->arraySizes->getDimSize(3);
                                        assert(dimSize >= 0);
                                        coopmatKHRuse = static_cast<uint32_t>(dimSize) & 0b111;
                                        coopmatKHRUseValid = true;
                                    }
                                }
                                if (p.isCoopvecNV() && p.typeParameters) {
                                    basicType = p.typeParameters->basicType;
                                }
                            }